

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_Construct(CLzmaEnc *p)

{
  undefined1 local_40 [8];
  CLzmaEncProps props;
  CLzmaEnc *p_local;
  
  props._40_8_ = p;
  RangeEnc_Construct(&p->rc);
  MatchFinder_Construct((CMatchFinder *)(props._40_8_ + 0x38));
  LzmaEncProps_Init((CLzmaEncProps *)local_40);
  LzmaEnc_SetProps((CLzmaEncHandle)props._40_8_,(CLzmaEncProps *)local_40);
  LzmaEnc_FastPosInit((Byte *)(props._40_8_ + 0x304d4));
  LzmaEnc_InitPriceTables((UInt32 *)(props._40_8_ + 0x324d4));
  *(undefined8 *)(props._40_8_ + 0x33be0) = 0;
  *(undefined8 *)(props._40_8_ + 0x3d378) = 0;
  return;
}

Assistant:

void LzmaEnc_Construct(CLzmaEnc* p) {
  RangeEnc_Construct(&p->rc);
  MatchFinder_Construct(&p->matchFinderBase);
#ifdef COMPRESS_MF_MT
  MatchFinderMt_Construct(&p->matchFinderMt);
  p->matchFinderMt.MatchFinder = &p->matchFinderBase;
#endif

  {
    CLzmaEncProps props;
    LzmaEncProps_Init(&props);
    LzmaEnc_SetProps(p, &props);
  }

#ifndef LZMA_LOG_BSR
  LzmaEnc_FastPosInit(p->g_FastPos);
#endif

  LzmaEnc_InitPriceTables(p->ProbPrices);
  p->litProbs = 0;
  p->saveState.litProbs = 0;
}